

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_buffer.c
# Opt level: O2

void test_cio_write_buffer_peek_and_last(void)

{
  cio_write_buffer *pcVar1;
  uint data1;
  char data2 [13];
  cio_write_buffer wb2;
  cio_write_buffer wb1;
  cio_write_buffer wbh;
  
  wbh.data.head.q_len = 0;
  wbh.data.element.length = 0;
  wbh.next = &wbh;
  wbh.prev = &wbh;
  UnityAssertEqualNumber
            (0,0,
             "Number of elements in write buffer not \'0\' after initialization of write buffer head!"
             ,0xa1,UNITY_DISPLAY_STYLE_INT);
  wb1.data.head.q_len = (size_t)&data1;
  data1 = 0x12;
  wb1.data.element.length = 4;
  cio_write_buffer_queue_tail(&wbh,&wb1);
  UnityAssertEqualNumber
            (1,wbh.data.head.q_len,
             "Number of elements in write buffer not \'1\' after inserting first element!",0xa8,
             UNITY_DISPLAY_STYLE_INT);
  wb2.data.head.q_len = (size_t)data2;
  builtin_strncpy(data2 + 8,"rld!",5);
  builtin_strncpy(data2,"Hello Wo",8);
  wb2.data.element.length = 0xd;
  cio_write_buffer_queue_tail(&wbh,&wb2);
  UnityAssertEqualNumber
            (2,wbh.data.head.q_len,
             "Number of elements in write buffer not \'2\' after inserting second element!",0xaf,
             UNITY_DISPLAY_STYLE_INT);
  pcVar1 = wbh.next;
  if (wbh.next == &wbh) {
    pcVar1 = (cio_write_buffer *)0x0;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&wb1,(UNITY_INT)pcVar1,"Peek() gave not the write buffer inserted first!",
             0xb2,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,wbh.data.head.q_len,"Number of elements changed after peek()!",0xb4,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,wbh.data.element.length,"Write buffer total length not correct!",0xb5,
             UNITY_DISPLAY_STYLE_INT);
  pcVar1 = wbh.prev;
  if (wbh.prev == &wbh) {
    pcVar1 = (cio_write_buffer *)0x0;
  }
  UnityAssertEqualNumber
            ((UNITY_INT)&wb2,(UNITY_INT)pcVar1,"Last() gave not the write buffer inserted last!",
             0xb8,UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (2,wbh.data.head.q_len,"Number of elements changed after last()!",0xba,
             UNITY_DISPLAY_STYLE_INT);
  UnityAssertEqualNumber
            (0x11,wbh.data.element.length,"Write buffer total length not correct!",0xbb,
             UNITY_DISPLAY_STYLE_INT);
  return;
}

Assistant:

static void test_cio_write_buffer_peek_and_last(void)
{
	struct cio_write_buffer wbh;
	cio_write_buffer_head_init(&wbh);
	size_t num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(0, num_elements, "Number of elements in write buffer not '0' after initialization of write buffer head!");

	unsigned int data1 = 0x12;
	struct cio_write_buffer wb1;
	cio_write_buffer_element_init(&wb1, &data1, sizeof(data1));
	cio_write_buffer_queue_tail(&wbh, &wb1);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(1, num_elements, "Number of elements in write buffer not '1' after inserting first element!");

	const char data2[] = "Hello World!";
	struct cio_write_buffer wb2;
	cio_write_buffer_const_element_init(&wb2, data2, sizeof(data2));
	cio_write_buffer_queue_tail(&wbh, &wb2);
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements in write buffer not '2' after inserting second element!");

	struct cio_write_buffer *peek = cio_write_buffer_queue_peek(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb1, peek, "Peek() gave not the write buffer inserted first!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after peek()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");

	struct cio_write_buffer *last = cio_write_buffer_queue_last(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(&wb2, last, "Last() gave not the write buffer inserted last!");
	num_elements = cio_write_buffer_get_num_buffer_elements(&wbh);
	TEST_ASSERT_EQUAL_MESSAGE(2, num_elements, "Number of elements changed after last()!");
	TEST_ASSERT_EQUAL_MESSAGE(sizeof(data1) + sizeof(data2), cio_write_buffer_get_total_size(&wbh), "Write buffer total length not correct!");
}